

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

void luaG_errormsg(lua_State *L)

{
  int iVar1;
  long lVar2;
  StkId pTVar3;
  int newsize;
  StkId pTVar4;
  
  lVar2 = L->errfunc;
  if (lVar2 != 0) {
    pTVar4 = L->stack;
    if (*(int *)((long)&pTVar4->tt + lVar2) != 6) {
      luaD_throw(L,5);
    }
    pTVar3 = L->top;
    pTVar3->value = pTVar3[-1].value;
    pTVar3->tt = pTVar3[-1].tt;
    pTVar3 = L->top;
    pTVar3[-1].value = *(Value *)((long)&pTVar4->value + lVar2);
    pTVar3[-1].tt = *(int *)((long)&pTVar4->tt + lVar2);
    pTVar4 = L->top;
    if ((long)L->stack_last - (long)pTVar4 < 0x11) {
      iVar1 = L->stacksize;
      newsize = iVar1 * 2;
      if (iVar1 < 1) {
        newsize = iVar1 + 1;
      }
      luaD_reallocstack(L,newsize);
      pTVar4 = L->top;
    }
    L->top = pTVar4 + 1;
    luaD_call(L,pTVar4 + -1,1);
  }
  luaD_throw(L,2);
}

Assistant:

static void luaG_errormsg(lua_State*L){
if(L->errfunc!=0){
StkId errfunc=restorestack(L,L->errfunc);
if(!ttisfunction(errfunc))luaD_throw(L,5);
setobj(L,L->top,L->top-1);
setobj(L,L->top-1,errfunc);
incr_top(L);
luaD_call(L,L->top-2,1);
}
luaD_throw(L,2);
}